

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateStructForwardDeclarations
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,string *title,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *listedStructs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  string *psVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  _Base_ptr p_Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type __n;
  pointer __k;
  char *__lhs;
  pointer pRVar10;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  string structureType;
  string str;
  size_type *local_188;
  size_type local_180;
  size_type local_178;
  undefined8 uStack_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  _Base_ptr local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  VulkanHppGenerator *local_100;
  pointer local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  size_type local_88;
  long local_80 [2];
  string *local_70;
  string *local_68;
  pointer local_60;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_58;
  pointer local_50;
  _Base_ptr local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
  *local_40;
  pointer local_38;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  pRVar10 = (requireData->
            super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (requireData->
             super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_100 = this;
  local_70 = title;
  local_68 = __return_storage_ptr__;
  if (pRVar10 != local_60) {
    local_40 = &this->m_structs;
    local_48 = &(this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header;
    paVar1 = &local_120.field_2;
    local_58 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)listedStructs;
    do {
      __k = (pRVar10->types).
            super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (pRVar10->types).
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_50 = pRVar10;
      if (__k != local_38) {
        do {
          local_f8 = __k;
          local_148 = (_Base_ptr)
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                      ::find(&local_40->_M_t,&__k->name);
          if ((local_148 != local_48) &&
             (pVar11 = std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string_const&>
                                 ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                   *)listedStructs,&local_f8->name),
             ((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
            local_188 = &local_178;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Vk","");
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_168,*(long *)(local_148 + 1),
                       (long)&(local_148[1]._M_parent)->_M_color + *(long *)(local_148 + 1));
            sVar3 = local_180;
            __n = local_168._M_string_length;
            if (local_180 <= local_168._M_string_length) {
              __n = local_180;
            }
            if ((local_180 <= local_168._M_string_length) &&
               ((__n == 0 || (iVar6 = bcmp(local_168._M_dataplus._M_p,local_188,__n), iVar6 == 0))))
            {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                        (&local_168,0,sVar3);
            }
            if (local_188 != &local_178) {
              operator_delete(local_188,local_178 + 1);
            }
            p_Var4 = local_148;
            __lhs = "  struct ";
            if (*(char *)((long)&local_148[3]._M_left + 2) != '\0') {
              __lhs = "  union ";
            }
            std::operator+(&local_120,__lhs,&local_168);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_120,";\n");
            local_188 = &local_178;
            psVar2 = (size_type *)(pbVar7->_M_dataplus)._M_p;
            paVar9 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar2 == paVar9) {
              local_178 = paVar9->_M_allocated_capacity;
              uStack_170 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            }
            else {
              local_178 = paVar9->_M_allocated_capacity;
              local_188 = psVar2;
            }
            local_180 = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_b0,(char *)local_188,local_180);
            if (local_188 != &local_178) {
              operator_delete(local_188,local_178 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != paVar1) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            p_Var8 = p_Var4[2]._M_right;
            local_148 = (_Base_ptr)&p_Var4[2]._M_parent;
            if (p_Var8 != local_148) {
              do {
                local_90 = local_80;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Vk","");
                local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_140,*(long *)(p_Var8 + 1),
                           (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
                sVar3 = local_88;
                if ((local_88 <= local_140._M_string_length) &&
                   ((local_88 == 0 ||
                    (iVar6 = bcmp(local_140._M_dataplus._M_p,local_90,local_88), iVar6 == 0)))) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  erase(&local_140,0,sVar3);
                }
                pbVar7 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                   (&local_140,0,0,"  using ",8);
                local_f0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
                paVar9 = &pbVar7->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p == paVar9) {
                  local_f0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                }
                else {
                  local_f0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                }
                local_f0._M_string_length = pbVar7->_M_string_length;
                (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
                pbVar7->_M_string_length = 0;
                (pbVar7->field_2)._M_local_buf[0] = '\0';
                pbVar7 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_f0," = ");
                local_d0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
                paVar9 = &pbVar7->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p == paVar9) {
                  local_d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                }
                else {
                  local_d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                }
                local_d0._M_string_length = pbVar7->_M_string_length;
                (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
                pbVar7->_M_string_length = 0;
                (pbVar7->field_2)._M_local_buf[0] = '\0';
                pbVar7 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_d0,local_168._M_dataplus._M_p,local_168._M_string_length);
                local_120._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
                paVar9 = &pbVar7->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p == paVar9) {
                  local_120.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                  local_120._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_120.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                }
                local_120._M_string_length = pbVar7->_M_string_length;
                (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
                pbVar7->_M_string_length = 0;
                (pbVar7->field_2)._M_local_buf[0] = '\0';
                pbVar7 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_120,";\n");
                local_188 = &local_178;
                psVar2 = (size_type *)(pbVar7->_M_dataplus)._M_p;
                paVar9 = &pbVar7->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar2 == paVar9) {
                  local_178 = paVar9->_M_allocated_capacity;
                  uStack_170 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                }
                else {
                  local_178 = paVar9->_M_allocated_capacity;
                  local_188 = psVar2;
                }
                local_180 = pbVar7->_M_string_length;
                (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
                pbVar7->_M_string_length = 0;
                (pbVar7->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_b0,(char *)local_188,local_180);
                if (local_188 != &local_178) {
                  operator_delete(local_188,local_178 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p != paVar1) {
                  operator_delete(local_120._M_dataplus._M_p,
                                  local_120.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  local_d0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_dataplus._M_p != &local_140.field_2) {
                  operator_delete(local_140._M_dataplus._M_p,
                                  local_140.field_2._M_allocated_capacity + 1);
                }
                if (local_90 != local_80) {
                  operator_delete(local_90,local_80[0] + 1);
                }
                p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
              } while (p_Var8 != local_148);
            }
            listedStructs =
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58;
            pRVar10 = local_50;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,
                              CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                       local_168.field_2._M_local_buf[0]) + 1);
              listedStructs =
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58;
              pRVar10 = local_50;
            }
          }
          __k = local_f8 + 1;
        } while (__k != local_38);
      }
      pRVar10 = pRVar10 + 1;
    } while (pRVar10 != local_60);
  }
  psVar5 = local_68;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  addTitleAndProtection(local_68,local_100,local_70,&local_b0,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return psVar5;
}

Assistant:

std::string VulkanHppGenerator::generateStructForwardDeclarations( std::vector<RequireData> const & requireData,
                                                                   std::string const &              title,
                                                                   std::set<std::string> &          listedStructs ) const
{
  std::string str;
  for ( auto const & require : requireData )
  {
    for ( auto const & type : require.types )
    {
      auto structIt = m_structs.find( type.name );
      if ( ( structIt != m_structs.end() ) && listedStructs.insert( type.name ).second )
      {
        std::string structureType = stripPrefix( structIt->first, "Vk" );
        str += ( structIt->second.isUnion ? "  union " : "  struct " ) + structureType + ";\n";

        for ( auto const & alias : structIt->second.aliases )
        {
          str += "  using " + stripPrefix( alias.first, "Vk" ) + " = " + structureType + ";\n";
        }
      }
    }
  }
  return addTitleAndProtection( title, str );
}